

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O0

int __thiscall CTcSymPropBase::write_to_obj_file(CTcSymPropBase *this,CVmFile *fp)

{
  CVmFile *in_RDI;
  bool bVar1;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint local_4;
  
  bVar1 = (in_RDI[2].seek_base_ & 0x10000) != 0;
  if (bVar1) {
    CTcSymbolBase::write_to_obj_file
              ((CTcSymbolBase *)in_RDI,
               (CVmFile *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    CVmFile::write_uint4(in_RDI,in_stack_ffffffffffffffdc);
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

int CTcSymPropBase::write_to_obj_file(CVmFile *fp)
{
    /* 
     *   If the property has never been referenced, don't bother writing it.
     *   We must have picked up the definition from an external symbol set we
     *   loaded but have no references of our own to the property.  
     */
    if (!ref_)
        return FALSE;

    /* inherit default */
    CTcSymbol::write_to_obj_file(fp);

    /* 
     *   write my local property ID value - when we load the object file,
     *   we'll need to figure out the translation from our original numbering
     *   system to the new numbering system used in the final image file 
     */
    fp->write_uint4((ulong)prop_);

    /* written */
    return TRUE;
}